

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_warn(lua_State *L)

{
  int idx;
  char *pcVar1;
  int iVar2;
  bool bVar3;
  
  idx = lua_gettop(L);
  luaL_checklstring(L,1,(size_t *)0x0);
  if (1 < idx) {
    iVar2 = 2;
    do {
      luaL_checklstring(L,iVar2,(size_t *)0x0);
      bVar3 = iVar2 != idx;
      iVar2 = iVar2 + 1;
    } while (bVar3);
    iVar2 = 1;
    do {
      pcVar1 = lua_tolstring(L,iVar2,(size_t *)0x0);
      lua_warning(L,pcVar1,1);
      iVar2 = iVar2 + 1;
    } while (idx != iVar2);
  }
  pcVar1 = lua_tolstring(L,idx,(size_t *)0x0);
  lua_warning(L,pcVar1,0);
  return 0;
}

Assistant:

static int luaB_warn (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  luaL_checkstring(L, 1);  /* at least one argument */
  for (i = 2; i <= n; i++)
    luaL_checkstring(L, i);  /* make sure all arguments are strings */
  for (i = 1; i < n; i++)  /* compose warning */
    lua_warning(L, lua_tostring(L, i), 1);
  lua_warning(L, lua_tostring(L, n), 0);  /* close warning */
  return 0;
}